

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O0

int apprun_string_list_len(char **x)

{
  int local_1c;
  int len;
  char **x_local;
  
  if (x == (char **)0x0) {
    x_local._4_4_ = 0;
  }
  else {
    for (local_1c = 0; x[local_1c] != (char *)0x0; local_1c = local_1c + 1) {
    }
    x_local._4_4_ = local_1c;
  }
  return x_local._4_4_;
}

Assistant:

int apprun_string_list_len(char *const *x) {
    if (x == NULL)
        return 0;

    int len = 0;
    while (x[len] != 0)
        len++;

    return len;
}